

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> this_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> __value;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *pbVar1;
  buffer_appender<char> *it;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_stack_ffffffffffffffe8;
  
  this_00.container = (buffer<char> *)reserve(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  __value.container =
       (buffer<char> *)buffer_appender<char>::operator++(in_stack_ffffffffffffffd8.container,0);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
            ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&stack0xffffffffffffffd8);
  pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)this_00.container,
                      (value_type_conflict1 *)__value.container);
  return (ssize_t)pbVar1;
}

Assistant:

void write(char value) {
    auto&& it = reserve(1);
    *it++ = value;
  }